

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.hh
# Opt level: O2

string * tchecker::parsing::system_declaration_t::location_map_key
                   (string *__return_storage_ptr__,string *process_name,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,process_name,":");
  std::operator+(__return_storage_ptr__,&bStack_38,name);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline static std::string location_map_key(std::string const & process_name, std::string const & name)
  {
    return (process_name + ":" + name);
  }